

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,OneofDescriptor **args)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *this_00;
  char *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000030;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000038;
  Printer *in_stack_00000040;
  OneofDescriptor *in_stack_ffffffffffffff28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  string *psVar1;
  iterator in_stack_ffffffffffffff68;
  undefined1 *puVar2;
  undefined1 local_75 [13];
  string *local_68;
  string local_60 [32];
  string *local_40;
  undefined8 local_38;
  
  local_68 = local_60;
  ToString_abi_cxx11_(in_stack_ffffffffffffff28);
  local_40 = local_60;
  local_38 = 1;
  puVar2 = local_75;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x50de38);
  __l._M_len = (size_type)puVar2;
  __l._M_array = in_stack_ffffffffffffff68;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffff60,__l,in_stack_ffffffffffffff58);
  io::Printer::FormatInternal
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff40);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x50de98);
  psVar1 = local_60;
  this_00 = (string *)&local_40;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != psVar1);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }